

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

Vector_Dense<double,_3UL> *
Disa::operator*(Vector_Dense<double,_3UL> *__return_storage_ptr__,Matrix_Sparse *matrix,
               Vector_Dense<double,_3UL> *vector)

{
  pointer puVar1;
  pointer puVar2;
  ostream *poVar3;
  source_location *in_RCX;
  unsigned_long __val;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined **local_20;
  
  if (matrix->column_size == 3) {
    puVar1 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((puVar1 != puVar2) && ((long)puVar1 - (long)puVar2 == 0x20)) {
      local_148 = std::
                  _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_sparse.hpp:1111:3)>
                  ::_M_invoke;
      local_150 = std::
                  _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_sparse.hpp:1111:3)>
                  ::_M_manager;
      local_160._M_unused._M_object = matrix;
      local_160._8_8_ = vector;
      Vector_Dense<double,_3UL>::Vector_Dense
                (__return_storage_ptr__,(function<double_(unsigned_long)> *)&local_160,3);
      std::_Function_base::~_Function_base((_Function_base *)&local_160);
      return __return_storage_ptr__;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_140._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0017b278;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160,
               (Disa *)0x0,(Log_Level)&local_140,in_RCX);
    poVar3 = std::operator<<(poVar3,(string *)local_160._M_pod_data);
    poVar3 = std::operator<<(poVar3,"For static vectors the matrix must be square.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_20 = &PTR_s__workspace_llm4binary_github_lic_0017b260;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160,
               (Disa *)0x0,(Log_Level)&local_20,in_RCX);
    poVar3 = std::operator<<(poVar3,(string *)local_160._M_pod_data);
    puVar1 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    __val = 0;
    if (puVar1 != puVar2) {
      __val = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_e0,__val);
    std::operator+(&local_c0,"Incompatible vector-matrix dimensions, ",&local_e0);
    std::operator+(&local_a0,&local_c0,",");
    std::__cxx11::to_string(&local_100,matrix->column_size);
    std::operator+(&local_80,&local_a0,&local_100);
    std::operator+(&local_60,&local_80," vs. ");
    std::__cxx11::to_string(&local_120,3);
    std::operator+(&local_40,&local_60,&local_120);
    std::operator+(&local_140,&local_40,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_140);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::~string((string *)local_160._M_pod_data);
  exit(1);
}

Assistant:

Vector_Dense<Scalar, _size> operator*(const Matrix_Sparse& matrix, const Vector_Dense<Scalar, _size>& vector) {
  ASSERT_DEBUG(matrix.size_column() == vector.size(),
               "Incompatible vector-matrix dimensions, " + std::to_string(matrix.size_row()) + "," +
               std::to_string(matrix.size_column()) + " vs. " + std::to_string(vector.size()) + ".");
  ASSERT_DEBUG(!_size || matrix.size_row() == vector.size(), "For static vectors the matrix must be square.");
  return Vector_Dense<Scalar, _size>(
  [&](const std::size_t i_row, Scalar value = 0) {
    FOR_ITER(iter, *(matrix.begin() + i_row)) value += *iter * vector[iter.i_column()];
    return value;
  },
  matrix.size_row());
}